

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O1

void __thiscall
icu_63::DateFormatSymbols::setZoneStrings
          (DateFormatSymbols *this,UnicodeString **strings,int32_t rowCount,int32_t columnCount)

{
  disposeZoneStrings(this);
  this->fZoneStringsRowCount = rowCount;
  this->fZoneStringsColCount = columnCount;
  createZoneStrings(this,strings);
  return;
}

Assistant:

void
DateFormatSymbols::setZoneStrings(const UnicodeString* const *strings, int32_t rowCount, int32_t columnCount)
{
    // since deleting a 2-d array is a pain in the butt, we offload that task to
    // a separate function
    disposeZoneStrings();
    // we always own the new list, which we create here (we duplicate rather
    // than adopting the list passed in)
    fZoneStringsRowCount = rowCount;
    fZoneStringsColCount = columnCount;
    createZoneStrings((const UnicodeString**)strings);
}